

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

void __thiscall
TPZMatrix<TFad<6,_double>_>::AddKel
          (TPZMatrix<TFad<6,_double>_> *this,TPZFMatrix<TFad<6,_double>_> *elmat,
          TPZVec<long> *source,TPZVec<long> *destinationindex)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  TFad<6,_double> *pTVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  TFad<6,_double> prevval;
  undefined **local_b0;
  double local_a8;
  undefined **appuStack_a0 [2];
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined1 local_70 [8];
  double local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  lVar1 = source->fNElements;
  local_b0 = &PTR__TFad_0185d2b8;
  local_a8 = 0.0;
  appuStack_a0[0] = (undefined **)0x0;
  appuStack_a0[1] = (undefined **)0x0;
  uStack_90 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_78 = 0;
  iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x10])();
  if (iVar6 == 0) {
    if (0 < lVar1) {
      lVar10 = 0;
      do {
        lVar2 = destinationindex->fStore[lVar10];
        lVar3 = source->fStore[lVar10];
        lVar9 = 0;
        do {
          lVar4 = destinationindex->fStore[lVar9];
          lVar8 = source->fStore[lVar9];
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (local_70,this,lVar2,lVar4);
          uStack_80 = CONCAT44(uStack_3c,local_40);
          local_78 = CONCAT44(uStack_34,uStack_38);
          uStack_90 = CONCAT44(uStack_4c,local_50);
          local_88 = CONCAT44(uStack_44,uStack_48);
          appuStack_a0[0] = (undefined **)local_60;
          appuStack_a0[1] = (undefined **)uStack_58;
          local_a8 = local_68;
          if ((((lVar3 < 0) ||
               ((elmat->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.fRow <= lVar3)) ||
              (lVar8 < 0)) ||
             ((elmat->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.fCol <= lVar8)) {
            TPZFMatrix<TFad<6,_double>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar8 = lVar8 * (elmat->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.fRow;
          pTVar5 = elmat->fElem;
          lVar7 = 2;
          do {
            (&local_b0)[lVar7] =
                 (undefined **)(pTVar5[lVar8 + lVar3].dx_[lVar7 + -2] + (double)(&local_b0)[lVar7]);
            lVar7 = lVar7 + 1;
          } while (lVar7 != 8);
          local_a8 = pTVar5[lVar8 + lVar3].val_ + local_68;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,lVar2,lVar4,&local_b0);
          lVar9 = lVar9 + 1;
        } while (lVar9 != lVar1);
        lVar10 = lVar10 + 1;
      } while (lVar10 != lVar1);
    }
  }
  else if (0 < lVar1) {
    lVar10 = 0;
    do {
      lVar2 = destinationindex->fStore[lVar10];
      lVar3 = source->fStore[lVar10];
      lVar9 = lVar10;
      do {
        lVar4 = destinationindex->fStore[lVar9];
        lVar8 = source->fStore[lVar9];
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (local_70,this,lVar2,lVar4);
        uStack_80 = CONCAT44(uStack_3c,local_40);
        local_78 = CONCAT44(uStack_34,uStack_38);
        uStack_90 = CONCAT44(uStack_4c,local_50);
        local_88 = CONCAT44(uStack_44,uStack_48);
        appuStack_a0[0] = (undefined **)local_60;
        appuStack_a0[1] = (undefined **)uStack_58;
        local_a8 = local_68;
        if (((lVar3 < 0) ||
            ((elmat->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.fRow <= lVar3)) ||
           ((lVar8 < 0 ||
            ((elmat->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.fCol <= lVar8)))) {
          TPZFMatrix<TFad<6,_double>_>::Error
                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar8 = lVar8 * (elmat->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.fRow;
        pTVar5 = elmat->fElem;
        lVar7 = 2;
        do {
          (&local_b0)[lVar7] =
               (undefined **)(pTVar5[lVar8 + lVar3].dx_[lVar7 + -2] + (double)(&local_b0)[lVar7]);
          lVar7 = lVar7 + 1;
        } while (lVar7 != 8);
        local_a8 = pTVar5[lVar8 + lVar3].val_ + local_68;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar2,lVar4,&local_b0);
        lVar9 = lVar9 + 1;
      } while (lVar9 < lVar1);
      lVar10 = lVar10 + 1;
    } while (lVar10 != lVar1);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::AddKel(TPZFMatrix<TVar> &elmat, TPZVec<int64_t> &source, TPZVec<int64_t> &destinationindex) {
	
	int64_t nelem = source.NElements();
  	int64_t icoef,jcoef,ieq,jeq,ieqs,jeqs;
    TVar prevval;
	if(IsSymmetric()) {
		for(icoef=0; icoef<nelem; icoef++) {
			ieq = destinationindex[icoef];
			ieqs = source[icoef];
			for(jcoef=icoef; jcoef<nelem; jcoef++) {
				jeq = destinationindex[jcoef];
				jeqs = source[jcoef];
				prevval = GetVal(ieq,jeq);
				prevval += elmat(ieqs,jeqs);
				PutVal(ieq,jeq,prevval);
			}
		}
	} else {
		for(icoef=0; icoef<nelem; icoef++) {
			ieq = destinationindex[icoef];
			ieqs = source[icoef];
			for(jcoef=0; jcoef<nelem; jcoef++) {
				jeq = destinationindex[jcoef];
				jeqs = source[jcoef];
				prevval = GetVal(ieq,jeq);
				prevval += elmat(ieqs,jeqs);
				PutVal(ieq,jeq,prevval);
			}
		}
	}
}